

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O1

unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> * __thiscall
xscript::parser::ast_node::replace_child(ast_node *this,type_t t)

{
  pointer puVar1;
  ast_node *__ptr;
  _Head_base<0UL,_xscript::parser::ast_node_*,_false> _Var2;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *puVar3;
  default_delete<xscript::parser::ast_node> *this_00;
  _Head_base<0UL,_xscript::parser::ast_node_*,_false> local_20;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> t1;
  
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar1 != (this->children).
                super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    local_20._M_head_impl =
         puVar1[-1]._M_t.
         super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
         ._M_t.
         super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
         .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl;
    puVar1[-1]._M_t.
    super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
    ._M_t.
    super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
    .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl = (ast_node *)0x0;
    puVar3 = (this->children).
             super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->children).
    super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar3;
    std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
    ~unique_ptr(puVar3);
    puVar3 = add_child(this,t);
    this_00 = (default_delete<xscript::parser::ast_node> *)
              add_child((puVar3->_M_t).
                        super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                        .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl,
                        (local_20._M_head_impl)->type);
    _Var2._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ast_node *)0x0;
    __ptr = *(ast_node **)this_00;
    *(ast_node **)this_00 = _Var2._M_head_impl;
    if (__ptr != (ast_node *)0x0) {
      std::default_delete<xscript::parser::ast_node>::operator()(this_00,__ptr);
    }
    std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
    ~unique_ptr((unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                 *)&local_20);
    return puVar3;
  }
  puVar3 = add_child(this,t);
  return puVar3;
}

Assistant:

std::unique_ptr<ast_node>& ast_node::replace_child(type_t t) {
    if (children.size() == 0) {
        return add_child(t);
    } else {
        std::unique_ptr<ast_node> t1 = std::move(children.back());
        children.pop_back();
        std::unique_ptr<ast_node>& t2 = add_child(t);
        std::unique_ptr<ast_node>& t3 = t2->add_child(t1->get_type());
        t3 = std::move(t1);
        return t2;
    }
}